

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

FunctionValue *
SelectBestFunction(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ArrayView<FunctionValue> functions,IntrusiveList<TypeHandle> generics,
                  ArrayView<ArgumentData> arguments,SmallArray<unsigned_int,_32U> *ratings)

{
  CallArgumentData *__s;
  Allocator *pAVar1;
  TypeBase *pTVar2;
  ExpressionContext *pEVar3;
  MatchData *pMVar4;
  TypeStruct *pTVar5;
  FunctionData *pFVar6;
  SynBase *pSVar7;
  ExprBase *pEVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  FunctionValue proto;
  uint uVar11;
  FunctionValue *pFVar12;
  SynBase *pSVar13;
  FunctionData *pFVar14;
  ExprBase *pEVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  TypeHandle *pTVar20;
  undefined4 extraout_var;
  TypeFunction *instance;
  TypeFunction **ppTVar21;
  TypeHandle *pTVar22;
  uint *puVar23;
  uint uVar24;
  IntrusiveList<MatchData> *pIVar25;
  uint i;
  uint uVar26;
  ulong uVar27;
  FunctionData *pFVar28;
  FunctionData *pFVar29;
  ExpressionContext *type;
  ExpressionContext *pEVar30;
  IntrusiveList<TypeHandle> *pIVar31;
  ulong uVar32;
  TypeClass *pTVar33;
  ExpressionContext *this;
  ulong uVar34;
  SynBase *pSVar35;
  uint arg;
  ExprBase **ppEVar36;
  uint i_1;
  ExprBase *pEVar37;
  ExprBase *pEVar38;
  ArrayView<CallArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  IntrusiveList<TypeHandle> generics_00;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<CallArgumentData> arguments_03;
  SynBase *local_278;
  FunctionValue *local_260;
  uint local_24c;
  ScopeData *local_238;
  uint extraRating;
  SynBase *local_228;
  TypeHandle *local_220;
  SynBase *local_218;
  FunctionData *local_210;
  ExprBase *local_208;
  FunctionValue *local_200;
  IntrusiveList<MatchData> aliases;
  SmallArray<TypeFunction_*,_16U> instanceTypes;
  SmallArray<CallArgumentData,_16U> result;
  
  local_260 = functions.data;
  uVar27 = functions._8_8_ & 0xffffffff;
  local_228 = source;
  local_200 = __return_storage_ptr__;
  SmallArray<unsigned_int,_32U>::resize(ratings,functions.count);
  pAVar1 = ctx->allocator;
  instanceTypes.data = instanceTypes.little;
  instanceTypes.count = 0;
  instanceTypes.max = 0x10;
  __s = result.little;
  uVar34 = 0;
  this = (ExpressionContext *)__s;
  instanceTypes.allocator = pAVar1;
  memset(__s,0,0x100);
  result.count = 0;
  result.max = 0x10;
  local_220 = generics.head;
  type = (ExpressionContext *)0x0;
  pTVar22 = generics.head;
  result.data = __s;
  result.allocator = pAVar1;
  do {
    if (uVar34 == uVar27) {
      if (type != (ExpressionContext *)0x0) {
        for (uVar34 = 0; uVar34 != uVar27; uVar34 = uVar34 + 1) {
          pFVar28 = local_260[uVar34].function;
          for (uVar32 = 0; uVar32 != uVar27; uVar32 = uVar32 + 1) {
            if (uVar34 != uVar32) {
              uVar17 = ratings->data[uVar32];
              if ((uVar17 != 0xffffffff) && (ratings->data[uVar34] == uVar17)) {
                pFVar6 = local_260[uVar32].function;
                uVar26 = (uint)uVar34;
                ppTVar21 = SmallArray<TypeFunction_*,_16U>::operator[](&instanceTypes,uVar26);
                uVar17 = IntrusiveList<TypeHandle>::size(&(*ppTVar21)->arguments);
                ppTVar21 = SmallArray<TypeFunction_*,_16U>::operator[](&instanceTypes,(uint)uVar32);
                this = (ExpressionContext *)&(*ppTVar21)->arguments;
                uVar19 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)this);
                if (uVar17 == uVar19) {
                  uVar17 = 0;
                  bVar16 = true;
                  while( true ) {
                    ppTVar21 = SmallArray<TypeFunction_*,_16U>::operator[](&instanceTypes,uVar26);
                    this = (ExpressionContext *)&(*ppTVar21)->arguments;
                    uVar19 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)this);
                    if (uVar19 <= uVar17) break;
                    ppTVar21 = SmallArray<TypeFunction_*,_16U>::operator[](&instanceTypes,uVar26);
                    pTVar22 = IntrusiveList<TypeHandle>::operator[](&(*ppTVar21)->arguments,uVar17);
                    pTVar2 = pTVar22->type;
                    ppTVar21 = SmallArray<TypeFunction_*,_16U>::operator[]
                                         (&instanceTypes,(uint)uVar32);
                    pTVar22 = IntrusiveList<TypeHandle>::operator[](&(*ppTVar21)->arguments,uVar17);
                    bVar16 = (bool)(bVar16 & pTVar2 == pTVar22->type);
                    uVar17 = uVar17 + 1;
                  }
                  if (bVar16) {
                    pTVar33 = (TypeClass *)pFVar28->scope->ownerType;
                    if ((pTVar33 == (TypeClass *)0x0) ||
                       ((pTVar33->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                      pTVar33 = (TypeClass *)0x0;
                    }
                    uVar17 = anon_unknown.dwarf_ff84f::GetDerivedFromDepth
                                       ((TypeClass *)type,pTVar33);
                    pTVar33 = (TypeClass *)pFVar6->scope->ownerType;
                    if ((pTVar33 == (TypeClass *)0x0) ||
                       ((pTVar33->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                      pTVar33 = (TypeClass *)0x0;
                    }
                    this = type;
                    uVar19 = anon_unknown.dwarf_ff84f::GetDerivedFromDepth
                                       ((TypeClass *)type,pTVar33);
                    if (uVar17 < uVar19) {
                      ratings->data[uVar32] = 0xffffffff;
                    }
                  }
                }
              }
            }
          }
        }
      }
      puVar23 = ratings->data;
      ppEVar36 = &local_260->context;
      local_208 = (ExprBase *)0x0;
      local_210 = (FunctionData *)0x0;
      local_218 = (SynBase *)0x0;
      local_278 = (SynBase *)0x0;
      local_24c = 0xffffffff;
      pFVar28 = (FunctionData *)0x0;
      pEVar37 = (ExprBase *)0x0;
      uVar17 = 0xffffffff;
      for (uVar34 = 0; pFVar12 = local_200, pTVar22 = generics.tail, uVar27 != uVar34;
          uVar34 = uVar34 + 1) {
        pSVar7 = ((FunctionValue *)(ppEVar36 + -2))->source;
        pFVar6 = (FunctionData *)ppEVar36[-1];
        pEVar8 = *ppEVar36;
        bVar16 = ExpressionContext::IsGenericFunction(this,pFVar6);
        uVar19 = puVar23[uVar34];
        pSVar13 = pSVar7;
        pFVar14 = pFVar6;
        pEVar15 = pEVar8;
        uVar26 = uVar19;
        pFVar29 = pFVar28;
        pEVar38 = pEVar37;
        pSVar35 = local_278;
        uVar24 = uVar17;
        uVar11 = local_24c;
        if (bVar16) {
          pSVar13 = local_218;
          pFVar14 = local_210;
          pEVar15 = local_208;
          uVar26 = local_24c;
          pFVar29 = pFVar6;
          pEVar38 = pEVar8;
          pSVar35 = pSVar7;
          uVar24 = uVar19;
          uVar11 = uVar17;
        }
        if (uVar11 <= uVar19) {
          pFVar29 = pFVar28;
          pSVar35 = local_278;
          pEVar38 = pEVar37;
          uVar24 = uVar17;
          uVar26 = local_24c;
          pSVar13 = local_218;
          pFVar14 = local_210;
          pEVar15 = local_208;
        }
        local_208 = pEVar15;
        local_210 = pFVar14;
        local_218 = pSVar13;
        local_24c = uVar26;
        ppEVar36 = ppEVar36 + 3;
        pFVar28 = pFVar29;
        pEVar37 = pEVar38;
        local_278 = pSVar35;
        uVar17 = uVar24;
      }
      local_200->function = local_210;
      local_200->context = local_208;
      local_200->source = local_218;
      if (uVar17 < local_24c) {
        local_200->source = local_278;
        local_200->function = pFVar28;
        local_200->context = pEVar37;
      }
      else {
        for (uVar34 = 0; uVar27 != uVar34; uVar34 = uVar34 + 1) {
          pFVar28 = local_260->function;
          bVar16 = ExpressionContext::IsGenericFunction(this,pFVar28);
          if (bVar16) {
            puVar23 = ratings->data;
            if ((((local_24c != 0xffffffff) && (puVar23[uVar34] == local_24c)) &&
                ((TypeStruct *)local_260->context->type == ctx->typeAutoRef)) &&
               (pFVar28->scope->ownerType->isGeneric == false)) {
              this = (ExpressionContext *)&aliases;
              proto.context._4_4_ = (int)((ulong)local_260->context >> 0x20);
              proto._0_20_ = *(undefined1 (*) [20])local_260;
              generics_00.tail = pTVar22;
              generics_00.head = local_220;
              CreateGenericFunctionInstance
                        ((FunctionValue *)this,ctx,local_228,proto,generics_00,arguments,true);
              puVar23 = ratings->data;
            }
            puVar23[uVar34] = 0xffffffff;
          }
          local_260 = local_260 + 1;
        }
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray(&result);
      SmallArray<TypeFunction_*,_16U>::~SmallArray(&instanceTypes);
      return pFVar12;
    }
    pFVar28 = local_260[uVar34].function;
    pEVar37 = local_260[uVar34].context;
    this = (ExpressionContext *)&instanceTypes;
    SmallArray<TypeFunction_*,_16U>::push_back
              ((SmallArray<TypeFunction_*,_16U> *)this,&pFVar28->type);
    pTVar2 = pEVar37->type;
    pEVar30 = type;
    if (((((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x12)) &&
         ((pEVar3 = (ExpressionContext *)pTVar2[1]._vptr_TypeBase,
          pEVar3 != (ExpressionContext *)0x0 &&
          ((*(uint *)&pEVar3->code == 0x18 &&
           (*(char *)((pEVar3->uniqueDependencies).little + 0x1c) == '\x01')))))) &&
        (pEVar30 = pEVar3, type != (ExpressionContext *)0x0)) && (pEVar30 = type, type != pEVar3)) {
      __assert_fail("preferredParent == typeClass",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x19f1,
                    "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                   );
    }
    if (pTVar22 == (TypeHandle *)0x0) {
LAB_001d2439:
      extraRating = 0;
      uVar9 = (pFVar28->arguments).data;
      uVar10 = (pFVar28->arguments).count;
      functionArguments.count = uVar10;
      functionArguments.data = (ArgumentData *)uVar9;
      functionArguments._12_4_ = 0;
      arguments_02._12_4_ = 0;
      arguments_02.data = (ArgumentData *)SUB128(arguments._0_12_,0);
      arguments_02.count = SUB124(arguments._0_12_,8);
      this = ctx;
      bVar16 = PrepareArgumentsForFunctionCall
                         (ctx,local_228,functionArguments,arguments_02,&result,&extraRating,false);
      if (!bVar16) goto LAB_001d2610;
      arguments_00.count = result.count;
      arguments_00.data = result.data;
      arguments_00._12_4_ = 0;
      this = ctx;
      uVar17 = GetFunctionRating(ctx,pFVar28,pFVar28->type,arguments_00);
      puVar23 = ratings->data;
      puVar23[uVar34] = uVar17;
      if (uVar17 != 0xffffffff) {
        puVar23[uVar34] = extraRating + uVar17;
        bVar16 = ExpressionContext::IsGenericFunction(this,pFVar28);
        if (bVar16) {
          pTVar5 = (TypeStruct *)pEVar37->type;
          local_238 = (ScopeData *)pFVar28->scope->ownerType;
          if (pTVar5 == ctx->typeAutoRef) {
            if (local_238 == (ScopeData *)0x0) {
              __assert_fail("function->scope->ownerType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x1a2b,
                            "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                           );
            }
          }
          else if (local_238 == (ScopeData *)0x0) {
            local_238 = (ScopeData *)0x0;
          }
          else {
            local_238 = pTVar5->typeScope;
          }
          aliases.head = (MatchData *)0x0;
          aliases.tail = (MatchData *)0x0;
          pIVar25 = &pFVar28->generics;
          pIVar31 = &generics;
          while ((pMVar4 = pIVar25->head, pMVar4 != (MatchData *)0x0 &&
                 (pTVar22 = pIVar31->head, pTVar22 != (TypeHandle *)0x0))) {
            iVar18 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            MatchData::MatchData
                      ((MatchData *)CONCAT44(extraout_var,iVar18),pMVar4->name,pTVar22->type);
            IntrusiveList<MatchData>::push_back(&aliases,(MatchData *)CONCAT44(extraout_var,iVar18))
            ;
            pIVar25 = (IntrusiveList<MatchData> *)&pMVar4->next;
            pIVar31 = (IntrusiveList<TypeHandle> *)&pTVar22->next;
          }
          arguments_03.count = result.count;
          arguments_03.data = result.data;
          arguments_03._12_4_ = 0;
          instance = GetGenericFunctionInstanceType
                               (ctx,local_228,(TypeBase *)local_238,pFVar28,arguments_03,&aliases);
          pTVar22 = local_220;
          this = (ExpressionContext *)&instanceTypes;
          ppTVar21 = SmallArray<TypeFunction_*,_16U>::back((SmallArray<TypeFunction_*,_16U> *)this);
          *ppTVar21 = instance;
          if (instance == (TypeFunction *)0x0) goto LAB_001d2610;
          arguments_01.count = result.count;
          arguments_01.data = result.data;
          arguments_01._12_4_ = 0;
          this = ctx;
          uVar17 = GetFunctionRating(ctx,pFVar28,instance,arguments_01);
          ratings->data[uVar34] = uVar17;
        }
      }
    }
    else {
      pIVar25 = &pFVar28->generics;
      for (pTVar20 = pTVar22;
          (pMVar4 = pIVar25->head, pMVar4 != (MatchData *)0x0 && (pTVar20 != (TypeHandle *)0x0));
          pTVar20 = pTVar20->next) {
        if ((pMVar4->type->isGeneric == false) && (pMVar4->type != pTVar20->type))
        goto LAB_001d2610;
        pIVar25 = (IntrusiveList<MatchData> *)&pMVar4->next;
      }
      if (pTVar20 == (TypeHandle *)0x0) goto LAB_001d2439;
LAB_001d2610:
      ratings->data[uVar34] = 0xffffffff;
    }
    uVar34 = uVar34 + 1;
    type = pEVar30;
  } while( true );
}

Assistant:

FunctionValue SelectBestFunction(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, SmallArray<unsigned, 32> &ratings)
{
	ratings.resize(functions.count);

	SmallArray<TypeFunction*, 16> instanceTypes(ctx.allocator);

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	TypeClass *preferredParent = NULL;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		instanceTypes.push_back(function->type);

		if(TypeRef *typeRef = getType<TypeRef>(value.context->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
			{
				if(typeClass->extendable)
				{
					if(!preferredParent)
						preferredParent = typeClass;
					else
						assert(preferredParent == typeClass);
				}
			}
		}

		if(!generics.empty())
		{
			MatchData *ca = function->generics.head;
			TypeHandle *cb = generics.head;

			bool sameGenerics = true;

			for(; ca && cb; ca = ca->next, cb = cb->next)
			{
				if(!ca->type->isGeneric && ca->type != cb->type)
				{
					sameGenerics = false;
					break;
				}
			}

			// Fail if provided explicit type list elements can't match
			if(!sameGenerics)
			{
				ratings.data[i] = ~0u;
				continue;
			}

			// Fail if provided explicit type list is larger than expected explicit type list
			if(cb)
			{
				ratings.data[i] = ~0u;
				continue;
			}
		}

		unsigned extraRating = 0;

		// Handle named argument order, default argument values and variadic functions
		if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, &extraRating, false))
		{
			ratings.data[i] = ~0u;
			continue;
		}

		ratings.data[i] = GetFunctionRating(ctx, function, function->type, result);

		if(ratings.data[i] == ~0u)
			continue;

		ratings.data[i] += extraRating;

		if(ctx.IsGenericFunction(function))
		{
			TypeBase *parentType = NULL;

			if(value.context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(value.context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;

			{
				MatchData *currMatch = function->generics.head;
				TypeHandle *currGeneric = generics.head;

				for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
					aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
			}

			TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

			instanceTypes.back() = instance;

			if(!instance)
			{
				ratings.data[i] = ~0u;
				continue;
			}
			
			ratings.data[i] = GetFunctionRating(ctx, function, instance, result);

			if(ratings.data[i] == ~0u)
				continue;
		}
	}

	// For member functions, if there are multiple functions with the same rating and arguments, hide those which parent is derived further from preferred parent
	if(preferredParent)
	{
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *a = functions.data[i].function;

			for(unsigned k = 0; k < functions.size(); k++)
			{
				if(i == k)
					continue;

				if(ratings.data[k] == ~0u)
					continue;

				FunctionData *b = functions.data[k].function;

				if(ratings.data[i] == ratings.data[k] && instanceTypes[i]->arguments.size() == instanceTypes[k]->arguments.size())
				{
					bool sameArguments = true;

					for(unsigned arg = 0; arg < instanceTypes[i]->arguments.size(); arg++)
					{
						if(instanceTypes[i]->arguments[arg]->type != instanceTypes[k]->arguments[arg]->type)
							sameArguments = false;
					}

					if(sameArguments)
					{
						unsigned aDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(a->scope->ownerType));
						unsigned bDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(b->scope->ownerType));

						if (aDepth < bDepth)
							ratings.data[k] = ~0u;
					}
				}
			}
		}
	}

	// Select best generic and non-generic function
	unsigned bestRating = ~0u;
	FunctionValue bestFunction;

	unsigned bestGenericRating = ~0u;
	FunctionValue bestGenericFunction;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		if(ctx.IsGenericFunction(function))
		{
			if(ratings.data[i] < bestGenericRating)
			{
				bestGenericRating = ratings.data[i];
				bestGenericFunction = value;
			}
		}
		else
		{
			if(ratings.data[i] < bestRating)
			{
				bestRating = ratings.data[i];
				bestFunction = value;
			}
		}
	}

	// Use generic function only if it is better that selected
	if(bestGenericRating < bestRating)
	{
		bestRating = bestGenericRating;
		bestFunction = bestGenericFunction;
	}
	else
	{
		// Hide all generic functions from selection
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *function = functions.data[i].function;

			if(ctx.IsGenericFunction(function))
			{
				if(bestRating != ~0u && ratings.data[i] == bestRating && functions.data[i].context->type == ctx.typeAutoRef && !function->scope->ownerType->isGeneric)
					CreateGenericFunctionInstance(ctx, source, functions.data[i], generics, arguments, true);

				ratings.data[i] = ~0u;
			}
		}
	}

	return bestFunction;
}